

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O0

optional<unsigned_long> __thiscall bloaty::dwarf::AttrValue::ToUint(AttrValue *this,CU *cu)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long *__t;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar3;
  CU *in_RDI;
  optional<unsigned_long> oVar4;
  string_view str;
  CU *in_stack_ffffffffffffff98;
  AttrValue *in_stack_ffffffffffffffa8;
  string_view local_40;
  uint64_t local_30;
  _Storage<unsigned_long,_true> local_10;
  undefined1 local_8;
  
  if (*(uint16_t *)&(in_RDI->entire_unit_)._M_str == 0x21) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_10);
    uVar3 = extraout_RDX;
  }
  else {
    bVar1 = IsUint((AttrValue *)in_RDI);
    if (bVar1) {
      local_30 = GetUint(in_stack_ffffffffffffffa8,in_RDI);
      std::optional<unsigned_long>::optional<unsigned_long,_true>
                ((optional<unsigned_long> *)in_RDI,(unsigned_long *)in_stack_ffffffffffffff98);
      uVar3 = extraout_RDX_00;
    }
    else {
      local_40 = GetString((AttrValue *)in_RDI,in_stack_ffffffffffffff98);
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_40);
      __t = (unsigned_long *)(sVar2 - 1);
      switch(__t) {
      case (unsigned_long *)0x0:
        ReadFixed<unsigned_char,1ul>((string_view *)in_RDI);
        std::optional<unsigned_long>::optional<unsigned_char,_true>
                  ((optional<unsigned_long> *)in_RDI,(uchar *)__t);
        uVar3 = extraout_RDX_01;
        break;
      case (unsigned_long *)0x1:
        ReadFixed<unsigned_char,1ul>((string_view *)in_RDI);
        std::optional<unsigned_long>::optional<unsigned_char,_true>
                  ((optional<unsigned_long> *)in_RDI,(uchar *)__t);
        uVar3 = extraout_RDX_02;
        break;
      default:
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_10);
        uVar3 = extraout_RDX_05;
        break;
      case (unsigned_long *)0x3:
        ReadFixed<unsigned_int,4ul>((string_view *)in_RDI);
        std::optional<unsigned_long>::optional<unsigned_int,_true>
                  ((optional<unsigned_long> *)in_RDI,(uint *)__t);
        uVar3 = extraout_RDX_03;
        break;
      case (unsigned_long *)0x7:
        ReadFixed<unsigned_long,8ul>((string_view *)in_RDI);
        std::optional<unsigned_long>::optional<unsigned_long,_true>
                  ((optional<unsigned_long> *)in_RDI,__t);
        uVar3 = extraout_RDX_04;
      }
    }
  }
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_8;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

absl::optional<uint64_t> AttrValue::ToUint(const CU& cu) const {
  if (form_ == DW_FORM_implicit_const) {
    // DW_FORM_implicit_const value is stored in AbbrevTable, but
    // we don't keep it in AttrValue (discarded in AbbrevTable::ReadAbbrevs()).
    // return absl::nullopt to make sure the value is not available.
    return absl::nullopt;
  }
  if (IsUint()) return GetUint(cu);
  string_view str = GetString(cu);
  switch (str.size()) {
    case 1:
      return ReadFixed<uint8_t>(&str);
    case 2:
      return ReadFixed<uint8_t>(&str);
    case 4:
      return ReadFixed<uint32_t>(&str);
    case 8:
      return ReadFixed<uint64_t>(&str);
  }
  return absl::nullopt;
}